

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProtocol.cpp
# Opt level: O3

Status __thiscall
mognetwork::protocol::TextProtocol::onReadAllTrigger(TextProtocol *this,Data *data)

{
  Data *this_00;
  size_t sVar1;
  pointer __src;
  char *__s;
  pointer __dest;
  Data *pDVar2;
  Status SVar3;
  char *pcVar4;
  pointer pcVar5;
  int iVar6;
  size_t readed;
  char buffer [1024];
  size_t local_448;
  Data *local_440;
  char local_438 [1032];
  
  SVar3 = TcpSocket::receive((this->super_AProtocolListener).m_socket,local_438,0x3ff,&local_448,0);
  if (SVar3 == Ok) {
    this_00 = &(this->super_AProtocolListener).m_pendingDatas.datas;
    local_440 = data;
    do {
      sVar1 = local_448 + 1;
      local_438[local_448] = '\0';
      local_448 = sVar1;
      std::vector<char,_std::allocator<char>_>::resize
                (this_00,(size_type)
                         ((this->super_AProtocolListener).m_pendingDatas.datas.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish +
                         (sVar1 - (long)(this->super_AProtocolListener).m_pendingDatas.datas.
                                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        super__Vector_impl_data._M_start)),'\0');
      strcat((this->super_AProtocolListener).m_pendingDatas.datas.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,local_438);
      __s = (this->super_AProtocolListener).m_pendingDatas.datas.
            super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
      ;
      pcVar4 = strchr(__s,10);
      pDVar2 = local_440;
      if (pcVar4 != (char *)0x0) {
        iVar6 = (int)((long)pcVar4 - (long)__s);
        if (iVar6 == 0) {
          if ((this->super_AProtocolListener).m_pendingDatas.datas.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish != __s) {
            (this->super_AProtocolListener).m_pendingDatas.datas.
            super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish = __s;
          }
          return Ok;
        }
        std::vector<char,_std::allocator<char>_>::resize
                  (local_440,((long)pcVar4 - (long)__s) + 2,'\0');
        pcVar5 = (this->super_AProtocolListener).m_pendingDatas.datas.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        memcpy((pDVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start,pcVar5,(long)pcVar4 - (long)pcVar5);
        (pDVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish[-1] = '\0';
        pcVar5 = (this->super_AProtocolListener).m_pendingDatas.datas.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        if ((long)pcVar5 -
            (long)(this->super_AProtocolListener).m_pendingDatas.datas.
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_start == (long)(iVar6 + 2)) {
          return Ok;
        }
        if (iVar6 < 0) {
          return Ok;
        }
        iVar6 = ((int)pcVar4 - (int)__s) + 1;
        do {
          __dest = (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          __src = __dest + 1;
          if (__src != pcVar5) {
            memmove(__dest,__src,(long)pcVar5 - (long)__src);
            pcVar5 = (this->super_AProtocolListener).m_pendingDatas.datas.
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish;
          }
          pcVar5 = pcVar5 + -1;
          (this->super_AProtocolListener).m_pendingDatas.datas.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
               = pcVar5;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
        if (pcVar4 != (char *)0x0) {
          return Ok;
        }
      }
      SVar3 = TcpSocket::receive((this->super_AProtocolListener).m_socket,local_438,0x3ff,&local_448
                                 ,0);
    } while (SVar3 == Ok);
  }
  return SVar3;
}

Assistant:

Socket::Status TextProtocol::onReadAllTrigger(TcpSocket::Data& data)
    {
      bool received = false;

      while (!received)
	{
	  std::size_t readed;
	  char buffer[1024];
	  
	  Socket::Status status = m_socket->receive(buffer, 1023, readed, 0);
	  if (status != Socket::Ok)
	    return status;
	  buffer[readed++] = 0;
	  m_pendingDatas.datas.resize(m_pendingDatas.datas.size() + readed);
	  std::strcat(&m_pendingDatas.datas[0], buffer);
	  char* l;
	  if ((l = std::strstr(&m_pendingDatas.datas[0], "\n")) != NULL)
	    {
	      int size = l - &m_pendingDatas.datas[0];
	      if (size == 0)
		{
		  m_pendingDatas.datas.clear();
		  break;
		}
	      
	      data.resize(l - &m_pendingDatas.datas[0] + 2);
	      std::memcpy(&data[0],
			  &m_pendingDatas.datas[0],
			  l - &m_pendingDatas.datas[0]);
	      data[data.size() - 1] = 0;
	      if (m_pendingDatas.datas.size() != size + 2)
		for (int i = 0; i < size + 1; ++i)
		  m_pendingDatas.datas.erase(m_pendingDatas.datas.begin());
	      received = true;
	    }
	}
      return Socket::Ok;
    }